

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeCloseStatement(Vdbe *p,int eOp)

{
  sqlite3 *db_00;
  Btree *p_00;
  int iSavepoint_00;
  Btree *pBt;
  int rc2;
  int iSavepoint;
  int i;
  int rc;
  sqlite3 *db;
  int eOp_local;
  Vdbe *p_local;
  
  db_00 = p->db;
  iSavepoint = 0;
  if ((db_00->nStatement != 0) && (p->iStatement != 0)) {
    iSavepoint_00 = p->iStatement + -1;
    for (rc2 = 0; rc2 < db_00->nDb; rc2 = rc2 + 1) {
      pBt._0_4_ = 0;
      p_00 = db_00->aDb[rc2].pBt;
      if (p_00 != (Btree *)0x0) {
        if (eOp == 2) {
          pBt._0_4_ = sqlite3BtreeSavepoint(p_00,2,iSavepoint_00);
        }
        if ((int)pBt == 0) {
          pBt._0_4_ = sqlite3BtreeSavepoint(p_00,1,iSavepoint_00);
        }
        if (iSavepoint == 0) {
          iSavepoint = (int)pBt;
        }
      }
    }
    db_00->nStatement = db_00->nStatement + -1;
    p->iStatement = 0;
    if (iSavepoint == 0) {
      if (eOp == 2) {
        iSavepoint = sqlite3VtabSavepoint(db_00,2,iSavepoint_00);
      }
      if (iSavepoint == 0) {
        iSavepoint = sqlite3VtabSavepoint(db_00,1,iSavepoint_00);
      }
    }
    if (eOp == 2) {
      db_00->nDeferredCons = p->nStmtDefCons;
    }
  }
  return iSavepoint;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCloseStatement(Vdbe *p, int eOp){
  sqlite3 *const db = p->db;
  int rc = SQLITE_OK;

  /* If p->iStatement is greater than zero, then this Vdbe opened a 
  ** statement transaction that should be closed here. The only exception
  ** is that an IO error may have occurred, causing an emergency rollback.
  ** In this case (db->nStatement==0), and there is nothing to do.
  */
  if( db->nStatement && p->iStatement ){
    int i;
    const int iSavepoint = p->iStatement-1;

    assert( eOp==SAVEPOINT_ROLLBACK || eOp==SAVEPOINT_RELEASE);
    assert( db->nStatement>0 );
    assert( p->iStatement==(db->nStatement+db->nSavepoint) );

    for(i=0; i<db->nDb; i++){ 
      int rc2 = SQLITE_OK;
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        if( eOp==SAVEPOINT_ROLLBACK ){
          rc2 = sqlite3BtreeSavepoint(pBt, SAVEPOINT_ROLLBACK, iSavepoint);
        }
        if( rc2==SQLITE_OK ){
          rc2 = sqlite3BtreeSavepoint(pBt, SAVEPOINT_RELEASE, iSavepoint);
        }
        if( rc==SQLITE_OK ){
          rc = rc2;
        }
      }
    }
    db->nStatement--;
    p->iStatement = 0;

    if( rc==SQLITE_OK ){
      if( eOp==SAVEPOINT_ROLLBACK ){
        rc = sqlite3VtabSavepoint(db, SAVEPOINT_ROLLBACK, iSavepoint);
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3VtabSavepoint(db, SAVEPOINT_RELEASE, iSavepoint);
      }
    }

    /* If the statement transaction is being rolled back, also restore the 
    ** database handles deferred constraint counter to the value it had when 
    ** the statement transaction was opened.  */
    if( eOp==SAVEPOINT_ROLLBACK ){
      db->nDeferredCons = p->nStmtDefCons;
    }
  }
  return rc;
}